

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportGlobal
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index global_index,Type type,bool mutable_)

{
  Module *this_00;
  byte bVar1;
  bool bVar2;
  pointer pGVar3;
  Location local_70;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> local_50;
  undefined1 local_48 [8];
  __single_object import;
  bool mutable__local;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderIR *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  import._M_t.super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._3_1_ = mutable_;
  import._M_t.super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._4_4_ = import_index;
  std::make_unique<wabt::GlobalImport>();
  pGVar3 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pGVar3->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.module_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  pGVar3 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pGVar3->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.field_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pGVar3 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                      local_48);
  bVar1 = import._M_t.
          super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
          super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._3_1_;
  (pGVar3->global).type = type;
  pGVar3 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                      local_48);
  (pGVar3->global).mutable_ = (bool)(bVar1 & 1);
  this_00 = this->module_;
  GetLocation(&local_70,this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
            (&local_50,(Location *)local_48);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_50);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *)
              &local_50);
  bVar2 = wabt::operator==(type,V128);
  (this->module_->features_used).simd = ((this->module_->features_used).simd & 1U) != 0 || bVar2;
  bVar2 = wabt::operator==(type,ExnRef);
  (this->module_->features_used).exceptions =
       ((this->module_->features_used).exceptions & 1U) != 0 || bVar2;
  Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::~unique_ptr
            ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)local_48);
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportGlobal(Index import_index,
                                      std::string_view module_name,
                                      std::string_view field_name,
                                      Index global_index,
                                      Type type,
                                      bool mutable_) {
  auto import = std::make_unique<GlobalImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->global.type = type;
  import->global.mutable_ = mutable_;
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  module_->features_used.simd |= (type == Type::V128);
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return Result::Ok;
}